

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O1

void __thiscall test_test::test_char_compare::test_method(test_char_compare *this)

{
  int iVar1;
  char **local_108;
  char **local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  assertion_result local_d8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  char ***local_a8;
  lazy_ostream local_a0;
  undefined1 *local_90;
  char *local_88;
  char rcca2 [6];
  char lcca2 [6];
  char rca1 [6];
  char lca1 [6];
  const_string local_60;
  char *rccpc4;
  char *rccp3;
  char *lccpc4;
  char *lccp3;
  
  builtin_strncpy(lca1,"World",6);
  builtin_strncpy(rca1,"World",6);
  builtin_strncpy(lcca2,"World",6);
  builtin_strncpy(rcca2,"World",6);
  lccp3 = "World";
  rccp3 = "World";
  lccpc4 = "World";
  rccpc4 = "World";
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_108 = (char **)0x1588cc;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_100 = (char **)0x1588cc;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x1d,CHECK,CHECK_EQUAL,2,"\"World\"",&local_f8,
             "\"World\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_100 = (char **)rca1;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rca1._4_2_ == 100 && rca1._0_4_ == 0x6c726f57);
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_108 = (char **)0x1588cc;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x1e,CHECK,CHECK_EQUAL,2,"\"World\"",&local_f8,"rca1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1f;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)rcca2;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rcca2._4_2_ == 100 && rcca2._0_4_ == 0x6c726f57);
  local_88 = "";
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_108 = (char **)0x1588cc;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x1f,CHECK,CHECK_EQUAL,2,"\"World\"",&local_f8,"rcca2",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x20;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(rccp3,"World");
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_108 = (char **)0x1588cc;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccp3;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x20,CHECK,CHECK_EQUAL,2,"\"World\"",&local_f8,"rccp3",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x21;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(rccpc4,"World");
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_108 = (char **)0x1588cc;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccpc4;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x21,CHECK,CHECK_EQUAL,2,"\"World\"",&local_f8,"rccpc4",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x23;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_108 = (char **)lca1;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lca1._4_2_ == 100 && lca1._0_4_ == 0x6c726f57);
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)0x1588cc;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x23,CHECK,CHECK_EQUAL,2,"lca1",&local_f8,"\"World\"",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x24;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lca1,rca1);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char **)lca1;
  local_100 = (char **)rca1;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x24,CHECK,CHECK_EQUAL,2,"lca1",&local_f8,"rca1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x25;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lca1,rcca2);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char **)lca1;
  local_100 = (char **)rcca2;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x25,CHECK,CHECK_EQUAL,2,"lca1",&local_f8,"rcca2",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x68);
  }
  else {
    iVar1 = strcmp(rccp3,lca1);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_108 = (char **)lca1;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccp3;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x26,CHECK,CHECK_EQUAL,2,"lca1",&local_f8,"rccp3",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x27;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x68);
  }
  else {
    iVar1 = strcmp(rccpc4,lca1);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_108 = (char **)lca1;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccpc4;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_108;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x27,CHECK,CHECK_EQUAL,2,"lca1",&local_f8,"rccpc4",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x29;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_108 = (char **)lcca2;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lcca2._4_2_ == 100 && lcca2._0_4_ == 0x6c726f57);
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)0x1588cc;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_108;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x29,CHECK,CHECK_EQUAL,2,"lcca2",&local_f8,"\"World\"",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2a;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lcca2,rca1);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char **)lcca2;
  local_100 = (char **)rca1;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x2a,CHECK,CHECK_EQUAL,2,"lcca2",&local_f8,"rca1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2b;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lcca2,rcca2);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char **)lcca2;
  local_100 = (char **)rcca2;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x2b,CHECK,CHECK_EQUAL,2,"lcca2",&local_f8,"rcca2",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2c;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x78);
  }
  else {
    iVar1 = strcmp(rccp3,lcca2);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_108 = (char **)lcca2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccp3;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x2c,CHECK,CHECK_EQUAL,2,"lcca2",&local_f8,"rccp3",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2d;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x78);
  }
  else {
    iVar1 = strcmp(rccpc4,lcca2);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_108 = (char **)lcca2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bcf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccpc4;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x2d,CHECK,CHECK_EQUAL,2,"lcca2",&local_f8,"rccpc4",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2f;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(lccp3,"World");
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)0x1588cc;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccp3;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x2f,CHECK,CHECK_EQUAL,2,"lccp3",&local_f8,"\"World\"",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x30;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x70);
  }
  else {
    iVar1 = strcmp(lccp3,rca1);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_100 = (char **)rca1;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccp3;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x30,CHECK,CHECK_EQUAL,2,"lccp3",&local_f8,"rca1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x31;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x80);
  }
  else {
    iVar1 = strcmp(lccp3,rcca2);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_100 = (char **)rcca2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccp3;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x31,CHECK,CHECK_EQUAL,2,"lccp3",&local_f8,"rcca2",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x32;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccp3 == (char *)0x0 || lccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(lccp3 == rccp3);
  }
  else {
    iVar1 = strcmp(lccp3,rccp3);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccp3;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccp3;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x32,CHECK,CHECK_EQUAL,2,"lccp3",&local_f8,"rccp3",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x33;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccpc4 == (char *)0x0 || lccp3 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(lccp3 == rccpc4);
  }
  else {
    iVar1 = strcmp(lccp3,rccpc4);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccpc4;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccp3;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x33,CHECK,CHECK_EQUAL,2,"lccp3",&local_f8,"rccpc4",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x35;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(lccpc4,"World");
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)0x1588cc;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccpc4;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x35,CHECK,CHECK_EQUAL,2,"lccpc4",&local_f8,"\"World\"",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x36;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x70);
  }
  else {
    iVar1 = strcmp(lccpc4,rca1);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_100 = (char **)rca1;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccpc4;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x36,CHECK,CHECK_EQUAL,2,"lccpc4",&local_f8,"rca1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (lccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(&stack0x00000000 == (undefined1 *)0x80);
  }
  else {
    iVar1 = strcmp(lccpc4,rcca2);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_100 = (char **)rcca2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccpc4;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x37,CHECK,CHECK_EQUAL,2,"lccpc4",&local_f8,"rcca2",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x38;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccp3 == (char *)0x0 || lccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(lccpc4 == rccp3);
  }
  else {
    iVar1 = strcmp(lccpc4,rccp3);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccp3;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccpc4;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x38,CHECK,CHECK_EQUAL,2,"lccpc4",&local_f8,"rccp3",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  if (rccpc4 == (char *)0x0 || lccpc4 == (char *)0x0) {
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(lccpc4 == rccpc4);
  }
  else {
    iVar1 = strcmp(lccpc4,rccpc4);
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_60.m_end = "";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0017bd30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rccpc4;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &lccpc4;
  local_e0 = (undefined1 *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_a0,&local_60,0x39,CHECK,CHECK_EQUAL,2,"lccpc4",&local_f8,"rccpc4",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_char_compare)
{
    char lca1[] = "World";
    char rca1[] = "World";
    const char lcca2[] = "World", rcca2[] = "World";
    const char *lccp3 = "World";
    const char *rccp3 = "World";
    const char * const lccpc4 = "World";
    const char * const rccpc4 = "World";

    BOOST_CHECK_EQUAL("World", "World");
    BOOST_CHECK_EQUAL("World", rca1);
    BOOST_CHECK_EQUAL("World", rcca2);
    BOOST_CHECK_EQUAL("World", rccp3);
    BOOST_CHECK_EQUAL("World", rccpc4);

    BOOST_CHECK_EQUAL(lca1, "World");
    BOOST_CHECK_EQUAL(lca1, rca1);
    BOOST_CHECK_EQUAL(lca1, rcca2);
    BOOST_CHECK_EQUAL(lca1, rccp3);
    BOOST_CHECK_EQUAL(lca1, rccpc4);

    BOOST_CHECK_EQUAL(lcca2, "World");
    BOOST_CHECK_EQUAL(lcca2, rca1);
    BOOST_CHECK_EQUAL(lcca2, rcca2);
    BOOST_CHECK_EQUAL(lcca2, rccp3);
    BOOST_CHECK_EQUAL(lcca2, rccpc4);

    BOOST_CHECK_EQUAL(lccp3, "World");
    BOOST_CHECK_EQUAL(lccp3, rca1);
    BOOST_CHECK_EQUAL(lccp3, rcca2);
    BOOST_CHECK_EQUAL(lccp3, rccp3);
    BOOST_CHECK_EQUAL(lccp3, rccpc4);

    BOOST_CHECK_EQUAL(lccpc4, "World");
    BOOST_CHECK_EQUAL(lccpc4, rca1);
    BOOST_CHECK_EQUAL(lccpc4, rcca2);
    BOOST_CHECK_EQUAL(lccpc4, rccp3);
    BOOST_CHECK_EQUAL(lccpc4, rccpc4);
}